

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_table_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  int iVar1;
  flatbuffers_uoffset_t base;
  uint local_1c;
  
  iVar1 = get_offset_field(td,id,required,&local_1c);
  if (local_1c != 0 && iVar1 == 0) {
    iVar1 = verify_table(td->buf,td->end,local_1c,
                         *(flatbuffers_uoffset_t *)((long)td->buf + (ulong)local_1c),td->ttl,tvf);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_field(flatcc_table_verifier_descriptor_t *td,
    voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}